

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_fusion.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::LoopFusion::UsedInContinueOrConditionBlock
          (LoopFusion *this,Instruction *phi_instruction,Loop *loop)

{
  Loop *def;
  bool bVar1;
  BasicBlock *pBVar2;
  DefUseManager *this_00;
  anon_class_16_3_be4ff52b local_60;
  function<bool_(spvtools::opt::Instruction_*)> local_50;
  uint32_t local_28;
  uint32_t uStack_24;
  bool not_used;
  uint32_t continue_block;
  uint32_t condition_block;
  Loop *loop_local;
  Instruction *phi_instruction_local;
  LoopFusion *this_local;
  
  _continue_block = loop;
  loop_local = (Loop *)phi_instruction;
  phi_instruction_local = (Instruction *)this;
  pBVar2 = Loop::FindConditionBlock(loop);
  uStack_24 = BasicBlock::id(pBVar2);
  pBVar2 = Loop::GetContinueBlock(_continue_block);
  local_28 = BasicBlock::id(pBVar2);
  this_00 = IRContext::get_def_use_mgr(this->context_);
  def = loop_local;
  local_60.condition_block = uStack_24;
  local_60.continue_block = local_28;
  local_60.this = this;
  std::function<bool(spvtools::opt::Instruction*)>::
  function<spvtools::opt::LoopFusion::UsedInContinueOrConditionBlock(spvtools::opt::Instruction*,spvtools::opt::Loop*)::__0,void>
            ((function<bool(spvtools::opt::Instruction*)> *)&local_50,&local_60);
  bVar1 = analysis::DefUseManager::WhileEachUser(this_00,(Instruction *)def,&local_50);
  std::function<bool_(spvtools::opt::Instruction_*)>::~function(&local_50);
  return (bool)((bVar1 ^ 0xffU) & 1);
}

Assistant:

bool LoopFusion::UsedInContinueOrConditionBlock(Instruction* phi_instruction,
                                                Loop* loop) {
  auto condition_block = loop->FindConditionBlock()->id();
  auto continue_block = loop->GetContinueBlock()->id();
  auto not_used = context_->get_def_use_mgr()->WhileEachUser(
      phi_instruction,
      [this, condition_block, continue_block](Instruction* instruction) {
        auto block_id = context_->get_instr_block(instruction)->id();
        return block_id != condition_block && block_id != continue_block;
      });

  return !not_used;
}